

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepFaceIntegrationPoints.h
# Opt level: O0

IntegrationPointList<2> *
anurbs::BrepFaceIntegrationPoints::get
          (IntegrationPointList<2> *__return_storage_ptr__,BrepFace *face,double tolerance)

{
  double dVar1;
  long lVar2;
  double dVar3;
  pointer ptVar4;
  bool bVar5;
  int iVar6;
  reference pRVar7;
  element_type *this;
  reference pRVar8;
  element_type *curve;
  element_type *peVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar10;
  Index IVar11;
  TrimTypes *pTVar12;
  size_t degree_u_00;
  size_t degree_v_00;
  reference ptVar13;
  __tuple_element_t<0UL,_tuple<double,_double,_double>_> *p_Var14;
  __tuple_element_t<1UL,_tuple<double,_double,_double>_> *p_Var15;
  __tuple_element_t<2UL,_tuple<double,_double,_double>_> *p_Var16;
  const_reference pvVar17;
  vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *__x;
  Interval IVar18;
  double local_3e8;
  Matrix<double,_1,_3,_1,_1,_3> local_3e0;
  Matrix<double,_1,_3,_1,_1,_3> local_3c8;
  undefined1 local_3b0 [8];
  Vector<3> n_1;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ders_1;
  type *weight_1;
  type *v_1;
  type *u_1;
  _Head_base<1UL,_double,_false> _Stack_360;
  _Head_base<0UL,_double,_false> local_358;
  __normal_iterator<const_std::tuple<double,_double,_double>_*,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>
  local_350;
  const_iterator __end6;
  const_iterator __begin6;
  IntegrationPointList<2> *__range6;
  IntegrationPointList<2> points_1;
  Polygon *polygon;
  const_iterator __end5_1;
  const_iterator __begin5_1;
  vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *__range5_1;
  vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> polygons;
  Matrix<double,_1,_3,_1,_1,_3> local_2e0;
  Matrix<double,_1,_3,_1,_1,_3> local_2c8;
  undefined1 local_2b0 [8];
  Vector<3> n;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ders;
  type *weight;
  type *v;
  type *u;
  _Head_base<1UL,_double,_false> _Stack_260;
  _Head_base<0UL,_double,_false> local_258;
  __normal_iterator<const_std::tuple<double,_double,_double>_*,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>
  local_248;
  const_iterator __end5;
  const_iterator __begin5;
  IntegrationPointList<2> *__range5;
  double local_228;
  Interval local_220;
  undefined1 local_210 [8];
  IntegrationPointList<2> points;
  Index j;
  Index i;
  long degree;
  Index degree_v;
  Index degree_u;
  vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> local_1b8;
  undefined1 local_1a0 [16];
  Ref<anurbs::NurbsSurfaceGeometry<3L>_> local_190;
  element_type *local_180;
  element_type *surface_geometry;
  undefined1 local_168 [24];
  Ref<anurbs::BrepTrim> trim;
  iterator __end3;
  iterator __begin3;
  vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_> local_128;
  vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_> *local_110;
  vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_> *__range3;
  Ref<anurbs::BrepLoop> loop;
  __normal_iterator<anurbs::Ref<anurbs::BrepLoop>_*,_std::vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_>_>
  local_f0;
  iterator __end2;
  iterator __begin2;
  vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_> local_d0;
  vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_> *local_b8;
  vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_> *__range2;
  undefined1 local_a8 [8];
  TrimmedSurfaceClipping clipper;
  double tolerance_local;
  BrepFace *face_local;
  IntegrationPointList<2> *integration_points;
  
  clipper.m_spans_v.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)tolerance;
  TrimmedSurfaceClipping::TrimmedSurfaceClipping
            ((TrimmedSurfaceClipping *)local_a8,tolerance * 10.0,tolerance / 10.0);
  __range2._7_1_ = 0;
  std::
  vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>::
  vector(__return_storage_ptr__);
  BrepFace::loops(&local_d0,face);
  local_b8 = &local_d0;
  __end2 = std::
           vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_>::
           begin(local_b8);
  local_f0._M_current =
       (Ref<anurbs::BrepLoop> *)
       std::vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_>::
       end(local_b8);
  while (bVar5 = __gnu_cxx::operator!=(&__end2,&local_f0), bVar5) {
    pRVar7 = __gnu_cxx::
             __normal_iterator<anurbs::Ref<anurbs::BrepLoop>_*,_std::vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_>_>
             ::operator*(&__end2);
    Ref<anurbs::BrepLoop>::Ref((Ref<anurbs::BrepLoop> *)&__range3,pRVar7);
    TrimmedSurfaceClipping::begin_loop((TrimmedSurfaceClipping *)local_a8);
    Ref<anurbs::BrepLoop>::operator->((Ref<anurbs::BrepLoop> *)&__begin3);
    this = std::__shared_ptr_access<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&__begin3);
    BrepLoop::trims(&local_128,this);
    std::shared_ptr<anurbs::BrepLoop>::~shared_ptr((shared_ptr<anurbs::BrepLoop> *)&__begin3);
    local_110 = &local_128;
    __end3 = std::
             vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
             ::begin(local_110);
    trim.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
         ::end(local_110);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<anurbs::Ref<anurbs::BrepTrim>_*,_std::vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>_>
                                       *)&trim.m_entry.
                                          super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount), bVar5) {
      pRVar8 = __gnu_cxx::
               __normal_iterator<anurbs::Ref<anurbs::BrepTrim>_*,_std::vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>_>
               ::operator*(&__end3);
      Ref<anurbs::BrepTrim>::Ref((Ref<anurbs::BrepTrim> *)(local_168 + 0x10),pRVar8);
      Ref<anurbs::BrepTrim>::operator->((Ref<anurbs::BrepTrim> *)&surface_geometry);
      std::__shared_ptr_access<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &surface_geometry);
      BrepTrim::curve_2d((BrepTrim *)local_168);
      curve = std::
              __shared_ptr_access<anurbs::Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<anurbs::Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_168);
      TrimmedSurfaceClipping::add_curve
                ((TrimmedSurfaceClipping *)local_a8,&curve->super_CurveBase<2L>);
      std::shared_ptr<anurbs::Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_>_>::
      ~shared_ptr((shared_ptr<anurbs::Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_>_>
                   *)local_168);
      std::shared_ptr<anurbs::BrepTrim>::~shared_ptr
                ((shared_ptr<anurbs::BrepTrim> *)&surface_geometry);
      Ref<anurbs::BrepTrim>::~Ref((Ref<anurbs::BrepTrim> *)(local_168 + 0x10));
      __gnu_cxx::
      __normal_iterator<anurbs::Ref<anurbs::BrepTrim>_*,_std::vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>_>
      ::operator++(&__end3);
    }
    loop.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 4;
    std::vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>::
    ~vector(&local_128);
    TrimmedSurfaceClipping::end_loop((TrimmedSurfaceClipping *)local_a8);
    Ref<anurbs::BrepLoop>::~Ref((Ref<anurbs::BrepLoop> *)&__range3);
    __gnu_cxx::
    __normal_iterator<anurbs::Ref<anurbs::BrepLoop>_*,_std::vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_>_>
    ::operator++(&__end2);
  }
  loop.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = 2;
  std::vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_>::
  ~vector(&local_d0);
  BrepFace::surface_geometry((BrepFace *)local_1a0);
  Ref<anurbs::NurbsSurfaceGeometry<3L>_>::data(&local_190);
  peVar9 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&local_190);
  std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>::~shared_ptr
            ((shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_> *)&local_190);
  Ref<anurbs::NurbsSurfaceGeometry<3L>_>::~Ref((Ref<anurbs::NurbsSurfaceGeometry<3L>_> *)local_1a0);
  local_180 = peVar9;
  (*(peVar9->super_SurfaceBase<3L>)._vptr_SurfaceBase[8])(&local_1b8);
  (*(local_180->super_SurfaceBase<3L>)._vptr_SurfaceBase[9])(&degree_u);
  TrimmedSurfaceClipping::compute
            ((TrimmedSurfaceClipping *)local_a8,&local_1b8,
             (vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&degree_u);
  std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::~vector
            ((vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&degree_u);
  std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::~vector(&local_1b8);
  iVar6 = (*(local_180->super_SurfaceBase<3L>)._vptr_SurfaceBase[2])();
  degree_v = CONCAT44(extraout_var,iVar6);
  iVar6 = (*(local_180->super_SurfaceBase<3L>)._vptr_SurfaceBase[3])();
  degree = CONCAT44(extraout_var_00,iVar6);
  plVar10 = std::max<long>(&degree_v,&degree);
  lVar2 = *plVar10;
  for (j = 0; IVar11 = TrimmedSurfaceClipping::nb_spans_u((TrimmedSurfaceClipping *)local_a8),
      j < IVar11; j = j + 1) {
    for (points.
         super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ptVar4 = points.
                 super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
        IVar11 = TrimmedSurfaceClipping::nb_spans_v((TrimmedSurfaceClipping *)local_a8),
        (long)ptVar4 < IVar11;
        points.
        super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)&((points.
                                super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                              super__Tuple_impl<0UL,_double,_double,_double>).
                              super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
                              super__Head_base<2UL,_double,_false>._M_head_impl + 1)) {
      pTVar12 = TrimmedSurfaceClipping::span_trim_type
                          ((TrimmedSurfaceClipping *)local_a8,j,
                           (Index)points.
                                  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (*pTVar12 != Empty) {
        pTVar12 = TrimmedSurfaceClipping::span_trim_type
                            ((TrimmedSurfaceClipping *)local_a8,j,
                             (Index)points.
                                    super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (*pTVar12 == Full) {
          degree_u_00 = degree_v + 1;
          degree_v_00 = degree + 1;
          IVar18 = TrimmedSurfaceClipping::span_u((TrimmedSurfaceClipping *)local_a8,j);
          local_220.m_t1 = IVar18.m_t1;
          local_220.m_t0 = IVar18.m_t0;
          IVar18 = TrimmedSurfaceClipping::span_v
                             ((TrimmedSurfaceClipping *)local_a8,
                              (Index)points.
                                     super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_228 = IVar18.m_t1;
          __range5 = (IntegrationPointList<2> *)IVar18.m_t0;
          IntegrationPoints::get
                    ((IntegrationPointList<2> *)local_210,degree_u_00,degree_v_00,&local_220,
                     (Interval *)&__range5);
          __end5 = std::
                   vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                   ::begin((vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                            *)local_210);
          local_248._M_current =
               (tuple<double,_double,_double> *)
               std::
               vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
               ::end((vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                      *)local_210);
          while (bVar5 = __gnu_cxx::operator!=(&__end5,&local_248), bVar5) {
            ptVar13 = __gnu_cxx::
                      __normal_iterator<const_std::tuple<double,_double,_double>_*,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>
                      ::operator*(&__end5);
            local_258._M_head_impl =
                 (ptVar13->super__Tuple_impl<0UL,_double,_double,_double>).
                 super__Head_base<0UL,_double,_false>._M_head_impl;
            u = (type *)(ptVar13->super__Tuple_impl<0UL,_double,_double,_double>).
                        super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
                        super__Head_base<2UL,_double,_false>._M_head_impl;
            _Stack_260._M_head_impl =
                 (ptVar13->super__Tuple_impl<0UL,_double,_double,_double>).
                 super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>.
                 _M_head_impl;
            p_Var14 = std::get<0ul,double,double,double>((tuple<double,_double,_double> *)&u);
            p_Var15 = std::get<1ul,double,double,double>((tuple<double,_double,_double> *)&u);
            p_Var16 = std::get<2ul,double,double,double>((tuple<double,_double,_double> *)&u);
            (*(local_180->super_SurfaceBase<3L>)._vptr_SurfaceBase[7])
                      (SUB84(*p_Var14,0),*p_Var15,
                       n.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                       m_data.array + 2,local_180,1);
            pvVar17 = std::
                      vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                      ::operator[]((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                                    *)(n.
                                       super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                       m_storage.m_data.array + 2),1);
            Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix(&local_2c8,pvVar17);
            pvVar17 = std::
                      vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                      ::operator[]((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                                    *)(n.
                                       super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                       m_storage.m_data.array + 2),2);
            Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix(&local_2e0,pvVar17);
            cross((Vector<3> *)local_2b0,&local_2c8,&local_2e0);
            dVar1 = *p_Var16;
            dVar3 = norm((Vector<3> *)local_2b0);
            polygons.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)(dVar1 * dVar3);
            std::
            vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>
            ::emplace_back<double_const&,double_const&,double>
                      ((vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>
                        *)__return_storage_ptr__,p_Var14,p_Var15,
                       (double *)
                       &polygons.
                        super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::
            vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
            ::~vector((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                       *)(n.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + 2));
            __gnu_cxx::
            __normal_iterator<const_std::tuple<double,_double,_double>_*,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>
            ::operator++(&__end5);
          }
          std::
          vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
          ::~vector((vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                     *)local_210);
        }
        else {
          __x = TrimmedSurfaceClipping::span_polygons
                          ((TrimmedSurfaceClipping *)local_a8,j,
                           (Index)points.
                                  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::vector
                    ((vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *)&__range5_1,__x);
          __end5_1 = std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::begin
                               ((vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *)
                                &__range5_1);
          polygon = (Polygon *)
                    std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::end
                              ((vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *)
                               &__range5_1);
          while (bVar5 = __gnu_cxx::operator!=
                                   (&__end5_1,
                                    (__normal_iterator<const_anurbs::Polygon_*,_std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>
                                     *)&polygon), bVar5) {
            points_1.
            super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)__gnu_cxx::
                          __normal_iterator<const_anurbs::Polygon_*,_std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>
                          ::operator*(&__end5_1);
            PolygonIntegrationPoints::get
                      ((IntegrationPointList<2> *)&__range6,lVar2 + 1,
                       (Polygon *)
                       points_1.
                       super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            __end6 = std::
                     vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                     ::begin((vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                              *)&__range6);
            local_350._M_current =
                 (tuple<double,_double,_double> *)
                 std::
                 vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                 ::end((vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                        *)&__range6);
            while (bVar5 = __gnu_cxx::operator!=(&__end6,&local_350), bVar5) {
              ptVar13 = __gnu_cxx::
                        __normal_iterator<const_std::tuple<double,_double,_double>_*,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>
                        ::operator*(&__end6);
              local_358._M_head_impl =
                   (ptVar13->super__Tuple_impl<0UL,_double,_double,_double>).
                   super__Head_base<0UL,_double,_false>._M_head_impl;
              u_1 = (type *)(ptVar13->super__Tuple_impl<0UL,_double,_double,_double>).
                            super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
                            super__Head_base<2UL,_double,_false>._M_head_impl;
              _Stack_360._M_head_impl =
                   (ptVar13->super__Tuple_impl<0UL,_double,_double,_double>).
                   super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>.
                   _M_head_impl;
              p_Var14 = std::get<0ul,double,double,double>((tuple<double,_double,_double> *)&u_1);
              p_Var15 = std::get<1ul,double,double,double>((tuple<double,_double,_double> *)&u_1);
              p_Var16 = std::get<2ul,double,double,double>((tuple<double,_double,_double> *)&u_1);
              (*(local_180->super_SurfaceBase<3L>)._vptr_SurfaceBase[7])
                        (SUB84(*p_Var14,0),*p_Var15,
                         n_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                         m_data.array + 2,local_180,1);
              pvVar17 = std::
                        vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                        ::operator[]((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                                      *)(n_1.
                                         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                                         .m_storage.m_data.array + 2),1);
              Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix(&local_3c8,pvVar17);
              pvVar17 = std::
                        vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                        ::operator[]((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                                      *)(n_1.
                                         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                                         .m_storage.m_data.array + 2),2);
              Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix(&local_3e0,pvVar17);
              cross((Vector<3> *)local_3b0,&local_3c8,&local_3e0);
              dVar1 = *p_Var16;
              local_3e8 = norm((Vector<3> *)local_3b0);
              local_3e8 = dVar1 * local_3e8;
              std::
              vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>
              ::emplace_back<double_const&,double_const&,double>
                        ((vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>
                          *)__return_storage_ptr__,p_Var14,p_Var15,&local_3e8);
              std::
              vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              ::~vector((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                         *)(n_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                            m_storage.m_data.array + 2));
              __gnu_cxx::
              __normal_iterator<const_std::tuple<double,_double,_double>_*,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>
              ::operator++(&__end6);
            }
            std::
            vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
            ::~vector((vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                       *)&__range6);
            __gnu_cxx::
            __normal_iterator<const_anurbs::Polygon_*,_std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>
            ::operator++(&__end5_1);
          }
          std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::~vector
                    ((vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *)&__range5_1);
        }
      }
    }
  }
  __range2._7_1_ = 1;
  loop.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = 1;
  TrimmedSurfaceClipping::~TrimmedSurfaceClipping((TrimmedSurfaceClipping *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

static IntegrationPointList<2> get(const BrepFace& face, const double tolerance)
    {
        TrimmedSurfaceClipping clipper(tolerance * 10, tolerance / 10);

        IntegrationPointList<2> integration_points;

        for (const auto loop : face.loops()) {
            clipper.begin_loop();

            for (const auto trim : loop->trims()) {
                clipper.add_curve(*trim->curve_2d());
            }

            clipper.end_loop();
        }

        const auto& surface_geometry = *face.surface_geometry().data();
        clipper.compute(surface_geometry.spans_u(), surface_geometry.spans_v());

        const auto degree_u = surface_geometry.degree_u();
        const auto degree_v = surface_geometry.degree_v();

        const auto degree = std::max(degree_u, degree_v) + 1;

        for (Index i = 0; i < clipper.nb_spans_u(); i++) {
            for (Index j = 0; j < clipper.nb_spans_v(); j++) {
                if (clipper.span_trim_type(i, j) == TrimTypes::Empty) {
                    continue;
                }

                if (clipper.span_trim_type(i, j) == TrimTypes::Full) {
                    const auto points = IntegrationPoints::get(degree_u + 1, degree_v + 1, clipper.span_u(i), clipper.span_v(j));

                    for (const auto [u, v, weight] : points) {
                        const auto ders = surface_geometry.derivatives_at(u, v, 1);

                        const auto n = cross(ders[1], ders[2]);

                        integration_points.emplace_back(u, v, weight * norm(n));
                    }
                } else {
                    const auto polygons = clipper.span_polygons(i, j);

                    for (const auto& polygon : polygons) {
                        const auto points = PolygonIntegrationPoints::get(degree, polygon);

                        for (const auto [u, v, weight] : points) {
                            const auto ders = surface_geometry.derivatives_at(u, v, 1);

                            const auto n = cross(ders[1], ders[2]);

                            integration_points.emplace_back(u, v, weight * norm(n));
                        }
                    }
                }
            }
        }

        return integration_points;
    }